

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::h_IADD_RS(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  int iVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *pvVar4;
  int in_EDX;
  Instruction *in_RSI;
  AssemblyGeneratorX86 *in_RDI;
  
  in_RDI->registerUsage[in_RSI->dst] = in_EDX;
  if (in_RSI->dst == '\x05') {
    poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tlea ");
    poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)in_RSI->dst * 8));
    poVar3 = std::operator<<(poVar3,", [");
    poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)in_RSI->dst * 8));
    poVar3 = std::operator<<(poVar3,"+");
    poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)in_RSI->src * 8));
    poVar3 = std::operator<<(poVar3,"*");
    iVar1 = Instruction::getModShift(in_RSI);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,1 << ((byte)iVar1 & 0x1f));
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::showpos);
    uVar2 = Instruction::getImm32((Instruction *)0x11454e);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,uVar2);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::noshowpos);
    poVar3 = std::operator<<(poVar3,"]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tlea ");
    poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)in_RSI->dst * 8));
    poVar3 = std::operator<<(poVar3,", [");
    poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)in_RSI->dst * 8));
    poVar3 = std::operator<<(poVar3,"+");
    poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)in_RSI->src * 8));
    poVar3 = std::operator<<(poVar3,"*");
    iVar1 = Instruction::getModShift(in_RSI);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1 << ((byte)iVar1 & 0x1f));
    poVar3 = std::operator<<(poVar3,"]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  traceint(in_RDI,in_RSI);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IADD_RS(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if(instr.dst == RegisterNeedsDisplacement)
			asmCode << "\tlea " << regR[instr.dst] << ", [" << regR[instr.dst] << "+" << regR[instr.src] << "*" << (1 << (instr.getModShift())) << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		else
			asmCode << "\tlea " << regR[instr.dst] << ", [" << regR[instr.dst] << "+" << regR[instr.src] << "*" << (1 << (instr.getModShift())) << "]" << std::endl;
		traceint(instr);
	}